

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

Box * __thiscall amrex::FabArrayBase::fabbox(Box *__return_storage_ptr__,FabArrayBase *this,int K)

{
  Box local_34;
  
  BoxArray::operator[](&local_34,&this->boxarray,K);
  *(ulong *)(__return_storage_ptr__->bigend).vect =
       CONCAT44(local_34.bigend.vect[1],local_34.bigend.vect[0]);
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = local_34._20_8_;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = local_34.smallend.vect._0_8_;
  *(ulong *)((__return_storage_ptr__->smallend).vect + 2) =
       CONCAT44(local_34.bigend.vect[0],local_34.smallend.vect[2]);
  Box::grow(__return_storage_ptr__,&this->n_grow);
  return __return_storage_ptr__;
}

Assistant:

Box
FabArrayBase::fabbox (int K) const noexcept
{
    return amrex::grow(boxarray[K], n_grow);
}